

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-abandon.c
# Opt level: O0

mi_segment_t * mi_arena_segment_clear_abandoned_next_list(mi_arena_field_cursor_t *previous)

{
  mi_segment_t *pmVar1;
  _Bool _Var2;
  long *in_RDI;
  mi_segment_t *segment;
  _Bool in_stack_00000027;
  mi_segment_t *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  if ((*(byte *)((long)in_RDI + 0x29) & 1) == 0) {
    if ((*(byte *)(in_RDI + 5) & 1) == 0) {
      _Var2 = mi_lock_try_acquire((pthread_mutex_t *)0xc72b42);
      in_stack_ffffffffffffffe4 = (uint)_Var2;
    }
    else {
      mi_lock_acquire((pthread_mutex_t *)
                      CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      in_stack_ffffffffffffffe4 = 1;
    }
    *(bool *)((long)in_RDI + 0x29) = in_stack_ffffffffffffffe4 != 0;
    if ((*(byte *)((long)in_RDI + 0x29) & 1) == 0) {
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        _mi_error_message(0xe,
                          "internal error: failed to visit all abandoned segments due to failure to acquire the OS visitor lock"
                         );
      }
      return (mi_segment_t *)0x0;
    }
  }
  while( true ) {
    if (*in_RDI == 0) {
      return (mi_segment_t *)0x0;
    }
    *in_RDI = *in_RDI + -1;
    mi_lock_acquire((pthread_mutex_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                   );
    pmVar1 = *(mi_segment_t **)(in_RDI[4] + 0x60);
    if ((pmVar1 == (mi_segment_t *)0x0) ||
       (_Var2 = mi_arena_segment_os_clear_abandoned(in_stack_00000028,in_stack_00000027), _Var2))
    break;
    mi_lock_release((pthread_mutex_t *)0xc72c27);
  }
  mi_lock_release((pthread_mutex_t *)0xc72c09);
  return pmVar1;
}

Assistant:

static mi_segment_t* mi_arena_segment_clear_abandoned_next_list(mi_arena_field_cursor_t* previous) {
  // go through the abandoned_os_list
  // we only allow one thread per sub-process to do to visit guarded by the `abandoned_os_visit_lock`.
  // The lock is released when the cursor is released.
  if (!previous->hold_visit_lock) {
    previous->hold_visit_lock = (previous->visit_all ? (mi_lock_acquire(&previous->subproc->abandoned_os_visit_lock),true)
                                                     : mi_lock_try_acquire(&previous->subproc->abandoned_os_visit_lock));
    if (!previous->hold_visit_lock) {
      if (previous->visit_all) {
        _mi_error_message(EFAULT, "internal error: failed to visit all abandoned segments due to failure to acquire the OS visitor lock");
      }
      return NULL; // we cannot get the lock, give up
    }
  }
  // One list entry at a time
  while (previous->os_list_count > 0) {
    previous->os_list_count--;
    mi_lock_acquire(&previous->subproc->abandoned_os_lock); // this could contend with concurrent OS block abandonment and reclaim from `free`
    mi_segment_t* segment = previous->subproc->abandoned_os_list;
    // pop from head of the list, a subsequent mark will push at the end (and thus we iterate through os_list_count entries)
    if (segment == NULL || mi_arena_segment_os_clear_abandoned(segment, false /* we already have the lock */)) {
      mi_lock_release(&previous->subproc->abandoned_os_lock);
      return segment;
    }
    // already abandoned, try again
    mi_lock_release(&previous->subproc->abandoned_os_lock);
  }
  // done
  mi_assert_internal(previous->os_list_count == 0);
  return NULL;
}